

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

int jx9Builtin_substr(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  int local_44;
  int local_40;
  int nSrcLen;
  int nLen;
  int nOfft;
  char *zOfft;
  char *zSource;
  jx9_value **apArg_local;
  jx9_context *pjStack_18;
  int nArg_local;
  jx9_context *pCtx_local;
  
  zSource = (char *)apArg;
  apArg_local._4_4_ = nArg;
  pjStack_18 = pCtx;
  if (nArg < 2) {
    jx9_result_bool(pCtx,0);
  }
  else {
    zOfft = jx9_value_to_string(*apArg,&local_44);
    if (local_44 < 1) {
      jx9_result_bool(pjStack_18,0);
    }
    else {
      local_40 = local_44;
      nSrcLen = jx9_value_to_int(*(jx9_value **)(zSource + 8));
      if (nSrcLen < 0) {
        _nLen = zOfft + (local_44 + nSrcLen);
        if (_nLen < zOfft) {
          jx9_result_bool(pjStack_18,0);
          return 0;
        }
        local_40 = ((int)zOfft + local_44) - (int)_nLen;
        nSrcLen = (int)_nLen - (int)zOfft;
      }
      else {
        if (local_44 <= nSrcLen) {
          jx9_result_bool(pjStack_18,0);
          return 0;
        }
        _nLen = zOfft + nSrcLen;
        local_40 = local_44 - nSrcLen;
      }
      if (2 < apArg_local._4_4_) {
        local_40 = jx9_value_to_int(*(jx9_value **)(zSource + 0x10));
        if (local_40 == 0) {
          jx9_result_string(pjStack_18,"",0);
          return 0;
        }
        if ((local_40 < 0) && (local_40 = (local_44 + local_40) - nSrcLen, local_40 < 1)) {
          local_40 = local_44 - nSrcLen;
        }
        if (local_44 < local_40 + nSrcLen) {
          local_40 = local_44 - nSrcLen;
        }
      }
      jx9_result_string(pjStack_18,_nLen,local_40);
    }
  }
  return 0;
}

Assistant:

static int jx9Builtin_substr(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	const char *zSource, *zOfft;
	int nOfft, nLen, nSrcLen;	
	if( nArg < 2 ){
		/* return FALSE */
		jx9_result_bool(pCtx, 0);
		return JX9_OK;
	}
	/* Extract the target string */
	zSource = jx9_value_to_string(apArg[0], &nSrcLen);
	if( nSrcLen < 1 ){
		/* Empty string, return FALSE */
		jx9_result_bool(pCtx, 0);
		return JX9_OK;
	}
	nLen = nSrcLen; /* cc warning */
	/* Extract the offset */
	nOfft = jx9_value_to_int(apArg[1]);
	if( nOfft < 0 ){
		zOfft = &zSource[nSrcLen+nOfft]; 
		if( zOfft < zSource ){
			/* Invalid offset */
			jx9_result_bool(pCtx, 0);
			return JX9_OK;
		}
		nLen = (int)(&zSource[nSrcLen]-zOfft);
		nOfft = (int)(zOfft-zSource);
	}else if( nOfft >= nSrcLen ){
		/* Invalid offset */
		jx9_result_bool(pCtx, 0);
		return JX9_OK;
	}else{
		zOfft = &zSource[nOfft];
		nLen = nSrcLen - nOfft;
	}
	if( nArg > 2 ){
		/* Extract the length */
		nLen = jx9_value_to_int(apArg[2]);
		if( nLen == 0 ){
			/* Invalid length, return an empty string */
			jx9_result_string(pCtx, "", 0);
			return JX9_OK;
		}else if( nLen < 0 ){
			nLen = nSrcLen + nLen - nOfft;
			if( nLen < 1 ){
				/* Invalid  length */
				nLen = nSrcLen - nOfft;
			}
		}
		if( nLen + nOfft > nSrcLen ){
			/* Invalid length */
			nLen = nSrcLen - nOfft;
		}
	}
	/* Return the substring */
	jx9_result_string(pCtx, zOfft, nLen);
	return JX9_OK;
}